

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaAttrInfoPtr xmlSchemaGetMetaAttrInfo(xmlSchemaValidCtxtPtr vctxt,int metaType)

{
  xmlSchemaAttrInfoPtr iattr;
  int i;
  int metaType_local;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  if (vctxt->nbAttrInfos != 0) {
    for (iattr._0_4_ = 0; (int)iattr < vctxt->nbAttrInfos; iattr._0_4_ = (int)iattr + 1) {
      if (vctxt->attrInfos[(int)iattr]->metaType == metaType) {
        return vctxt->attrInfos[(int)iattr];
      }
    }
  }
  return (xmlSchemaAttrInfoPtr)0x0;
}

Assistant:

static xmlSchemaAttrInfoPtr
xmlSchemaGetMetaAttrInfo(xmlSchemaValidCtxtPtr vctxt,
			 int metaType)
{
    if (vctxt->nbAttrInfos == 0)
	return (NULL);
    {
	int i;
	xmlSchemaAttrInfoPtr iattr;

	for (i = 0; i < vctxt->nbAttrInfos; i++) {
	    iattr = vctxt->attrInfos[i];
	    if (iattr->metaType == metaType)
		return (iattr);
	}

    }
    return (NULL);
}